

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  Message *pMVar1;
  Message *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  wchar_t *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  internal::String::ShowWideCString_abi_cxx11_(in_stack_ffffffffffffffc8);
  pMVar1 = operator<<(in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_30);
  return pMVar1;
}

Assistant:

Message& Message::operator <<(const wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}